

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConstraintBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConstraintBlockSyntax,slang::syntax::ConstraintBlockSyntax_const&>
          (BumpAllocator *this,ConstraintBlockSyntax *args)

{
  ConstraintBlockSyntax *this_00;
  
  this_00 = (ConstraintBlockSyntax *)allocate(this,0x70,8);
  slang::syntax::ConstraintBlockSyntax::ConstraintBlockSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }